

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_permute(ggml_context *ctx,ggml_tensor *a,int axis0,int axis1,int axis2,int axis3)

{
  undefined1 auVar1 [32];
  ggml_tensor *pgVar2;
  undefined8 uVar3;
  char *pcVar4;
  int nb [4];
  int ne [4];
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((uint)axis0 < 4) {
    if ((uint)axis1 < 4) {
      if ((uint)axis2 < 4) {
        if ((uint)axis3 < 4) {
          if (axis0 == axis1) {
            pcVar4 = "axis0 != axis1";
            uVar3 = 0xf45;
          }
          else if (axis0 == axis2) {
            pcVar4 = "axis0 != axis2";
            uVar3 = 0xf46;
          }
          else if (axis0 == axis3) {
            pcVar4 = "axis0 != axis3";
            uVar3 = 0xf47;
          }
          else if (axis1 == axis2) {
            pcVar4 = "axis1 != axis2";
            uVar3 = 0xf48;
          }
          else if (axis1 == axis3) {
            pcVar4 = "axis1 != axis3";
            uVar3 = 0xf49;
          }
          else if (axis2 == axis3) {
            pcVar4 = "axis2 != axis3";
            uVar3 = 0xf4a;
          }
          else {
            if (a->grad == (ggml_tensor *)0x0) {
              pgVar2 = ggml_view_tensor(ctx,a);
              *(int *)((long)&local_38 + (ulong)(uint)axis0 * 4) = a->ne[0];
              *(int *)((long)&local_38 + (ulong)(uint)axis1 * 4) = a->ne[1];
              *(int *)((long)&local_38 + (ulong)(uint)axis2 * 4) = a->ne[2];
              *(int *)((long)&local_38 + (ulong)(uint)axis3 * 4) = a->ne[3];
              *(int *)(local_48 + (ulong)(uint)axis0 * 4) = (int)a->nb[0];
              *(int *)(local_48 + (ulong)(uint)axis1 * 4) = (int)a->nb[1];
              *(int *)(local_48 + (ulong)(uint)axis2 * 4) = (int)a->nb[2];
              *(int *)(local_48 + (ulong)(uint)axis3 * 4) = (int)a->nb[3];
              *(undefined8 *)pgVar2->ne = local_38;
              *(undefined8 *)(pgVar2->ne + 2) = uStack_30;
              auVar1 = vpmovsxdq_avx2(local_48);
              *(undefined1 (*) [32])pgVar2->nb = auVar1;
              pgVar2->op = GGML_OP_PERMUTE;
              pgVar2->grad = (ggml_tensor *)0x0;
              pgVar2->src0 = a;
              pgVar2->src1 = (ggml_tensor *)0x0;
              return pgVar2;
            }
            pcVar4 = "false";
            uVar3 = 0xf4f;
          }
        }
        else {
          pcVar4 = "axis3 >= 0 && axis3 < GGML_MAX_DIMS";
          uVar3 = 0xf43;
        }
      }
      else {
        pcVar4 = "axis2 >= 0 && axis2 < GGML_MAX_DIMS";
        uVar3 = 0xf42;
      }
    }
    else {
      pcVar4 = "axis1 >= 0 && axis1 < GGML_MAX_DIMS";
      uVar3 = 0xf41;
    }
  }
  else {
    pcVar4 = "axis0 >= 0 && axis0 < GGML_MAX_DIMS";
    uVar3 = 0xf40;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar3,
          pcVar4);
  abort();
}

Assistant:

struct ggml_tensor * ggml_permute(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   axis0,
        int                   axis1,
        int                   axis2,
        int                   axis3) {
    GGML_ASSERT(axis0 >= 0 && axis0 < GGML_MAX_DIMS);
    GGML_ASSERT(axis1 >= 0 && axis1 < GGML_MAX_DIMS);
    GGML_ASSERT(axis2 >= 0 && axis2 < GGML_MAX_DIMS);
    GGML_ASSERT(axis3 >= 0 && axis3 < GGML_MAX_DIMS);

    GGML_ASSERT(axis0 != axis1);
    GGML_ASSERT(axis0 != axis2);
    GGML_ASSERT(axis0 != axis3);
    GGML_ASSERT(axis1 != axis2);
    GGML_ASSERT(axis1 != axis3);
    GGML_ASSERT(axis2 != axis3);

    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    int ne[GGML_MAX_DIMS];
    int nb[GGML_MAX_DIMS];

    ne[axis0] = a->ne[0];
    ne[axis1] = a->ne[1];
    ne[axis2] = a->ne[2];
    ne[axis3] = a->ne[3];

    nb[axis0] = a->nb[0];
    nb[axis1] = a->nb[1];
    nb[axis2] = a->nb[2];
    nb[axis3] = a->nb[3];

    result->ne[0] = ne[0];
    result->ne[1] = ne[1];
    result->ne[2] = ne[2];
    result->ne[3] = ne[3];

    result->nb[0] = nb[0];
    result->nb[1] = nb[1];
    result->nb[2] = nb[2];
    result->nb[3] = nb[3];

    result->op   = GGML_OP_PERMUTE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store the permutation here?

    return result;
}